

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall DACSThinker::Tick(DACSThinker *this)

{
  DLevelScript *pDVar1;
  DLevelScript *this_00;
  uint uVar2;
  
  this_00 = this->Scripts;
  uVar2 = ACS_StringBuilderStack.Count;
  while (ACS_StringBuilderStack.Count = uVar2, this_00 != (DLevelScript *)0x0) {
    pDVar1 = this_00->next;
    DLevelScript::RunScript(this_00);
    this_00 = pDVar1;
    uVar2 = ACS_StringBuilderStack.Count;
  }
  if (uVar2 == 0) {
    return;
  }
  TArray<FString,_FString>::DoDelete(&ACS_StringBuilderStack,0,uVar2 - 1);
  ACS_StringBuilderStack.Count = 0;
  I_Error("Error: %d garbage entries on ACS string builder stack.",(ulong)uVar2);
  return;
}

Assistant:

void DACSThinker::Tick ()
{
	DLevelScript *script = Scripts;

	while (script)
	{
		DLevelScript *next = script->next;
		script->RunScript ();
		script = next;
	}

//	GlobalACSStrings.Clear();

	if (ACS_StringBuilderStack.Size())
	{
		int size = ACS_StringBuilderStack.Size();
		ACS_StringBuilderStack.Clear();
		I_Error("Error: %d garbage entries on ACS string builder stack.", size);
	}
}